

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::entered4(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxId param_1,int n)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar2;
  pointer pnVar3;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  Item *pIVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  pointer pnVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar16;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *v;
  uint *puVar17;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar20;
  cpp_dec_float<200U,_int,_void> *pcVar21;
  long in_FS_OFFSET;
  byte bVar22;
  Real RVar23;
  cpp_dec_float<200U,_int,_void> uu;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  xi_ip;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  xi_p;
  cpp_dec_float<200U,_int,_void> local_518;
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_490;
  cpp_dec_float<200U,_int,_void> *local_488;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_480;
  pointer local_478;
  long local_470;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_468;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_3e0;
  cpp_dec_float<200U,_int,_void> local_3d8;
  cpp_dec_float<200U,_int,_void> local_358;
  double local_2d0;
  cpp_dec_float<200U,_int,_void> *local_2c8;
  pointer local_2c0;
  pointer local_2b8;
  pointer local_2b0;
  cpp_dec_float<200U,_int,_void> local_2a8;
  cpp_dec_float<200U,_int,_void> local_228;
  cpp_dec_float<200U,_int,_void> local_1a8;
  cpp_dec_float<200U,_int,_void> local_128;
  uint local_a0 [28];
  
  bVar22 = 0;
  if (-1 < n) {
    pSVar1 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    if (n < (pSVar1->thecovectors->set).thenum) {
      local_1a8.fpclass = cpp_dec_float_finite;
      local_1a8.prec_elem = 0x1c;
      local_1a8.data._M_elems[0] = 0;
      local_1a8.data._M_elems[1] = 0;
      local_1a8.data._M_elems[2] = 0;
      local_1a8.data._M_elems[3] = 0;
      local_1a8.data._M_elems[4] = 0;
      local_1a8.data._M_elems[5] = 0;
      local_1a8.data._M_elems[6] = 0;
      local_1a8.data._M_elems[7] = 0;
      local_1a8.data._M_elems[8] = 0;
      local_1a8.data._M_elems[9] = 0;
      local_1a8.data._M_elems[10] = 0;
      local_1a8.data._M_elems[0xb] = 0;
      local_1a8.data._M_elems[0xc] = 0;
      local_1a8.data._M_elems[0xd] = 0;
      local_1a8.data._M_elems[0xe] = 0;
      local_1a8.data._M_elems[0xf] = 0;
      local_1a8.data._M_elems[0x10] = 0;
      local_1a8.data._M_elems[0x11] = 0;
      local_1a8.data._M_elems[0x12] = 0;
      local_1a8.data._M_elems[0x13] = 0;
      local_1a8.data._M_elems[0x14] = 0;
      local_1a8.data._M_elems[0x15] = 0;
      local_1a8.data._M_elems[0x16] = 0;
      local_1a8.data._M_elems[0x17] = 0;
      local_1a8.data._M_elems[0x18] = 0;
      local_1a8.data._M_elems[0x19] = 0;
      local_1a8.data._M_elems._104_5_ = 0;
      local_1a8.data._M_elems[0x1b]._1_3_ = 0;
      local_1a8.exp = 0;
      local_1a8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_1a8,
                 1.0 / (double)(pSVar1->
                               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).iterCount + 2.0);
      pSVar1 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      local_478 = (this->workVec).
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_488 = &((pSVar1->coWeights).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_backend;
      local_2b0 = (pSVar1->weights).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      pUVar2 = pSVar1->theCoPvec;
      local_3e0 = pSVar1->thePvec;
      local_2b8 = (local_3e0->thedelta).
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_2c0 = (pUVar2->thedelta).
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      pnVar3 = (pSVar1->theFvec->thedelta).
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar14 = pnVar3 + (uint)n;
      pNVar18 = &local_468;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pNVar18->val).m_backend.data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (pointer)((long)pnVar14 + ((ulong)bVar22 * -2 + 1) * 4);
        pNVar18 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar18 + (ulong)bVar22 * -8 + 4);
      }
      local_468.val.m_backend.exp = pnVar3[(uint)n].m_backend.exp;
      local_468.val.m_backend.neg = pnVar3[(uint)n].m_backend.neg;
      local_468.val.m_backend.fpclass = pnVar3[(uint)n].m_backend.fpclass;
      local_468.val.m_backend.prec_elem = pnVar3[(uint)n].m_backend.prec_elem;
      local_128.fpclass = cpp_dec_float_finite;
      local_128.prec_elem = 0x1c;
      local_128.data._M_elems[0] = 0;
      local_128.data._M_elems[1] = 0;
      local_128.data._M_elems[2] = 0;
      local_128.data._M_elems[3] = 0;
      local_128.data._M_elems[4] = 0;
      local_128.data._M_elems[5] = 0;
      local_128.data._M_elems[6] = 0;
      local_128.data._M_elems[7] = 0;
      local_128.data._M_elems[8] = 0;
      local_128.data._M_elems[9] = 0;
      local_128.data._M_elems[10] = 0;
      local_128.data._M_elems[0xb] = 0;
      local_128.data._M_elems[0xc] = 0;
      local_128.data._M_elems[0xd] = 0;
      local_128.data._M_elems[0xe] = 0;
      local_128.data._M_elems[0xf] = 0;
      local_128.data._M_elems[0x10] = 0;
      local_128.data._M_elems[0x11] = 0;
      local_128.data._M_elems[0x12] = 0;
      local_128.data._M_elems[0x13] = 0;
      local_128.data._M_elems[0x14] = 0;
      local_128.data._M_elems[0x15] = 0;
      local_128.data._M_elems[0x16] = 0;
      local_128.data._M_elems[0x17] = 0;
      local_128.data._M_elems[0x18] = 0;
      local_128.data._M_elems[0x19] = 0;
      local_128.data._M_elems._104_5_ = 0;
      local_128.data._M_elems[0x1b]._1_3_ = 0;
      local_128.exp = 0;
      local_128.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_518,1,(type *)0x0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&local_128,&local_518,(cpp_dec_float<200U,_int,_void> *)&local_468);
      local_2a8.fpclass = cpp_dec_float_finite;
      local_2a8.prec_elem = 0x1c;
      local_2a8.data._M_elems[0] = 0;
      local_2a8.data._M_elems[1] = 0;
      local_2a8.data._M_elems[2] = 0;
      local_2a8.data._M_elems[3] = 0;
      local_2a8.data._M_elems[4] = 0;
      local_2a8.data._M_elems[5] = 0;
      local_2a8.data._M_elems[6] = 0;
      local_2a8.data._M_elems[7] = 0;
      local_2a8.data._M_elems[8] = 0;
      local_2a8.data._M_elems[9] = 0;
      local_2a8.data._M_elems[10] = 0;
      local_2a8.data._M_elems[0xb] = 0;
      local_2a8.data._M_elems[0xc] = 0;
      local_2a8.data._M_elems[0xd] = 0;
      local_2a8.data._M_elems[0xe] = 0;
      local_2a8.data._M_elems[0xf] = 0;
      local_2a8.data._M_elems[0x10] = 0;
      local_2a8.data._M_elems[0x11] = 0;
      local_2a8.data._M_elems[0x12] = 0;
      local_2a8.data._M_elems[0x13] = 0;
      local_2a8.data._M_elems[0x14] = 0;
      local_2a8.data._M_elems[0x15] = 0;
      local_2a8.data._M_elems[0x16] = 0;
      local_2a8.data._M_elems[0x17] = 0;
      local_2a8.data._M_elems[0x18] = 0;
      local_2a8.data._M_elems[0x19] = 0;
      local_2a8.data._M_elems._104_5_ = 0;
      local_2a8.data._M_elems[0x1b]._1_3_ = 0;
      local_2a8.exp = 0;
      local_2a8.neg = false;
      local_480 = pUVar2;
      local_470 = (long)(pUVar2->thedelta).super_IdxSet.num;
      local_490 = this;
      if (0 < local_470) {
        local_2c8 = &(this->pi_p).m_backend;
        local_2d0 = *(double *)(in_FS_OFFSET + -8);
        local_470 = local_470 + 1;
        do {
          iVar9 = (local_480->thedelta).super_IdxSet.idx[local_470 + -2];
          pcVar15 = &local_2c0[iVar9].m_backend;
          local_518.fpclass = cpp_dec_float_finite;
          local_518.prec_elem = 0x1c;
          local_518.data._M_elems[0] = 0;
          local_518.data._M_elems[1] = 0;
          local_518.data._M_elems[2] = 0;
          local_518.data._M_elems[3] = 0;
          local_518.data._M_elems[4] = 0;
          local_518.data._M_elems[5] = 0;
          local_518.data._M_elems[6] = 0;
          local_518.data._M_elems[7] = 0;
          local_518.data._M_elems[8] = 0;
          local_518.data._M_elems[9] = 0;
          local_518.data._M_elems[10] = 0;
          local_518.data._M_elems[0xb] = 0;
          local_518.data._M_elems[0xc] = 0;
          local_518.data._M_elems[0xd] = 0;
          local_518.data._M_elems[0xe] = 0;
          local_518.data._M_elems[0xf] = 0;
          local_518.data._M_elems[0x10] = 0;
          local_518.data._M_elems[0x11] = 0;
          local_518.data._M_elems[0x12] = 0;
          local_518.data._M_elems[0x13] = 0;
          local_518.data._M_elems[0x14] = 0;
          local_518.data._M_elems[0x15] = 0;
          local_518.data._M_elems[0x16] = 0;
          local_518.data._M_elems[0x17] = 0;
          local_518.data._M_elems[0x18] = 0;
          local_518.data._M_elems[0x19] = 0;
          local_518.data._M_elems._104_5_ = 0;
          local_518.data._M_elems[0x1b]._1_3_ = 0;
          local_518.exp = 0;
          local_518.neg = false;
          pcVar13 = &local_128;
          if (&local_518 != pcVar15) {
            pcVar21 = &local_518;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              *(uint *)pcVar21 = (pcVar13->data)._M_elems[0];
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar22 * -8 + 4);
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar21 + ((ulong)bVar22 * -2 + 1) * 4);
            }
            local_518.exp = local_128.exp;
            local_518.neg = local_128.neg;
            local_518.fpclass = local_128.fpclass;
            local_518.prec_elem = local_128.prec_elem;
            pcVar13 = pcVar15;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_518,pcVar13);
          pcVar13 = &local_518;
          pcVar15 = &local_2a8;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pcVar15->data)._M_elems[0] = *(uint *)pcVar13;
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar13 + ((ulong)bVar22 * -2 + 1) * 4);
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar22 * -8 + 4);
          }
          local_2a8.exp = local_518.exp;
          local_2a8.neg = local_518.neg;
          local_2a8.fpclass = local_518.fpclass;
          local_2a8.prec_elem = local_518.prec_elem;
          local_228.fpclass = cpp_dec_float_finite;
          local_228.prec_elem = 0x1c;
          local_228.data._M_elems[0] = 0;
          local_228.data._M_elems[1] = 0;
          local_228.data._M_elems[2] = 0;
          local_228.data._M_elems[3] = 0;
          local_228.data._M_elems[4] = 0;
          local_228.data._M_elems[5] = 0;
          local_228.data._M_elems[6] = 0;
          local_228.data._M_elems[7] = 0;
          local_228.data._M_elems[8] = 0;
          local_228.data._M_elems[9] = 0;
          local_228.data._M_elems[10] = 0;
          local_228.data._M_elems[0xb] = 0;
          local_228.data._M_elems[0xc] = 0;
          local_228.data._M_elems[0xd] = 0;
          local_228.data._M_elems[0xe] = 0;
          local_228.data._M_elems[0xf] = 0;
          local_228.data._M_elems[0x10] = 0;
          local_228.data._M_elems[0x11] = 0;
          local_228.data._M_elems[0x12] = 0;
          local_228.data._M_elems[0x13] = 0;
          local_228.data._M_elems[0x14] = 0;
          local_228.data._M_elems[0x15] = 0;
          local_228.data._M_elems[0x16] = 0;
          local_228.data._M_elems[0x17] = 0;
          local_228.data._M_elems[0x18] = 0;
          local_228.data._M_elems[0x19] = 0;
          local_228.data._M_elems._104_5_ = 0;
          local_228.data._M_elems[0x1b]._1_3_ = 0;
          local_228.exp = 0;
          local_228.neg = false;
          pcVar13 = &local_2a8;
          if (&local_228 != local_2c8) {
            pcVar15 = &local_228;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar22 * -8 + 4);
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar22 * -8 + 4);
            }
            local_228.exp = local_518.exp;
            local_228.neg = local_518.neg;
            local_228.fpclass = local_518.fpclass;
            local_228.prec_elem = local_518.prec_elem;
            pcVar13 = local_2c8;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_228,pcVar13);
          pcVar13 = &local_478[iVar9].m_backend;
          local_358.fpclass = cpp_dec_float_finite;
          local_358.prec_elem = 0x1c;
          local_358.data._M_elems[0] = 0;
          local_358.data._M_elems[1] = 0;
          local_358.data._M_elems[2] = 0;
          local_358.data._M_elems[3] = 0;
          local_358.data._M_elems[4] = 0;
          local_358.data._M_elems[5] = 0;
          local_358.data._M_elems[6] = 0;
          local_358.data._M_elems[7] = 0;
          local_358.data._M_elems[8] = 0;
          local_358.data._M_elems[9] = 0;
          local_358.data._M_elems[10] = 0;
          local_358.data._M_elems[0xb] = 0;
          local_358.data._M_elems[0xc] = 0;
          local_358.data._M_elems[0xd] = 0;
          local_358.data._M_elems[0xe] = 0;
          local_358.data._M_elems[0xf] = 0;
          local_358.data._M_elems[0x10] = 0;
          local_358.data._M_elems[0x11] = 0;
          local_358.data._M_elems[0x12] = 0;
          local_358.data._M_elems[0x13] = 0;
          local_358.data._M_elems[0x14] = 0;
          local_358.data._M_elems[0x15] = 0;
          local_358.data._M_elems[0x16] = 0;
          local_358.data._M_elems[0x17] = 0;
          local_358.data._M_elems[0x18] = 0;
          local_358.data._M_elems[0x19] = 0;
          local_358.data._M_elems._104_5_ = 0;
          local_358.data._M_elems[0x1b]._1_3_ = 0;
          local_358.exp = 0;
          local_358.neg = false;
          local_518.fpclass = cpp_dec_float_finite;
          local_518.prec_elem = 0x1c;
          local_518.data._M_elems[0] = 0;
          local_518.data._M_elems[1] = 0;
          local_518.data._M_elems[2] = 0;
          local_518.data._M_elems[3] = 0;
          local_518.data._M_elems[4] = 0;
          local_518.data._M_elems[5] = 0;
          local_518.data._M_elems[6] = 0;
          local_518.data._M_elems[7] = 0;
          local_518.data._M_elems[8] = 0;
          local_518.data._M_elems[9] = 0;
          local_518.data._M_elems[10] = 0;
          local_518.data._M_elems[0xb] = 0;
          local_518.data._M_elems[0xc] = 0;
          local_518.data._M_elems[0xd] = 0;
          local_518.data._M_elems[0xe] = 0;
          local_518.data._M_elems[0xf] = 0;
          local_518.data._M_elems[0x10] = 0;
          local_518.data._M_elems[0x11] = 0;
          local_518.data._M_elems[0x12] = 0;
          local_518.data._M_elems[0x13] = 0;
          local_518.data._M_elems[0x14] = 0;
          local_518.data._M_elems[0x15] = 0;
          local_518.data._M_elems[0x16] = 0;
          local_518.data._M_elems[0x17] = 0;
          local_518.data._M_elems[0x18] = 0;
          local_518.data._M_elems[0x19] = 0;
          local_518.data._M_elems._104_5_ = 0;
          local_518.data._M_elems[0x1b]._1_3_ = 0;
          local_518.exp = 0;
          local_518.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_518,2.0);
          if (&local_358 != pcVar13) {
            pcVar15 = pcVar13;
            pcVar21 = &local_358;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pcVar21->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar22 * -8 + 4);
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar22 * -8 + 4);
            }
            local_358.exp = pcVar13->exp;
            local_358.neg = pcVar13->neg;
            local_358.fpclass = pcVar13->fpclass;
            local_358.prec_elem = pcVar13->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_358,&local_518);
          local_3d8.fpclass = cpp_dec_float_finite;
          local_3d8.prec_elem = 0x1c;
          local_3d8.neg = false;
          local_3d8.exp = 0;
          pcVar13 = &local_228;
          pcVar15 = &local_3d8;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar22 * -8 + 4);
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar22 * -8 + 4);
          }
          local_3d8.exp = local_228.exp;
          local_3d8.neg = local_228.neg;
          local_3d8.fpclass = local_228.fpclass;
          local_3d8.prec_elem = local_228.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_3d8,&local_358);
          local_468.val.m_backend.fpclass = cpp_dec_float_finite;
          local_468.val.m_backend.prec_elem = 0x1c;
          local_468.val.m_backend.exp = 0;
          local_468.val.m_backend.neg = false;
          pcVar13 = &local_2a8;
          pNVar18 = &local_468;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pNVar18->val).m_backend.data._M_elems[0] = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar22 * -8 + 4);
            pNVar18 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)pNVar18 + (ulong)bVar22 * -8 + 4);
          }
          local_468.val.m_backend.exp = local_2a8.exp;
          local_468.val.m_backend.neg = local_2a8.neg;
          local_468.val.m_backend.fpclass = local_2a8.fpclass;
          local_468.val.m_backend.prec_elem = local_2a8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)&local_468,&local_3d8);
          pcVar15 = local_488;
          pcVar13 = local_488 + iVar9;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (pcVar13,(cpp_dec_float<200U,_int,_void> *)&local_468);
          if ((((((pointer)(pcVar15 + iVar9))->m_backend).fpclass == cpp_dec_float_NaN) ||
              (local_1a8.fpclass == cpp_dec_float_NaN)) ||
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (pcVar13,&local_1a8), -1 < iVar9)) {
            this = local_490;
            ::soplex::infinity::__tls_init();
            local_518.fpclass = cpp_dec_float_finite;
            local_518.prec_elem = 0x1c;
            local_518.data._M_elems[0] = 0;
            local_518.data._M_elems[1] = 0;
            local_518.data._M_elems[2] = 0;
            local_518.data._M_elems[3] = 0;
            local_518.data._M_elems[4] = 0;
            local_518.data._M_elems[5] = 0;
            local_518.data._M_elems[6] = 0;
            local_518.data._M_elems[7] = 0;
            local_518.data._M_elems[8] = 0;
            local_518.data._M_elems[9] = 0;
            local_518.data._M_elems[10] = 0;
            local_518.data._M_elems[0xb] = 0;
            local_518.data._M_elems[0xc] = 0;
            local_518.data._M_elems[0xd] = 0;
            local_518.data._M_elems[0xe] = 0;
            local_518.data._M_elems[0xf] = 0;
            local_518.data._M_elems[0x10] = 0;
            local_518.data._M_elems[0x11] = 0;
            local_518.data._M_elems[0x12] = 0;
            local_518.data._M_elems[0x13] = 0;
            local_518.data._M_elems[0x14] = 0;
            local_518.data._M_elems[0x15] = 0;
            local_518.data._M_elems[0x16] = 0;
            local_518.data._M_elems[0x17] = 0;
            local_518.data._M_elems[0x18] = 0;
            local_518.data._M_elems[0x19] = 0;
            local_518.data._M_elems._104_5_ = 0;
            local_518.data._M_elems[0x1b]._1_3_ = 0;
            local_518.exp = 0;
            local_518.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_518,local_2d0);
            if (((pcVar13->fpclass != cpp_dec_float_NaN) && (local_518.fpclass != cpp_dec_float_NaN)
                ) && (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              compare(pcVar13,&local_518), 0 < iVar9)) {
              RVar23 = Tolerances::epsilon((((this->
                                             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).thesolver)->
                                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              local_3d8.fpclass = cpp_dec_float_finite;
              local_3d8.prec_elem = 0x1c;
              local_3d8.data._M_elems[0] = 0;
              local_3d8.data._M_elems[1] = 0;
              local_3d8.data._M_elems[2] = 0;
              local_3d8.data._M_elems[3] = 0;
              local_3d8.data._M_elems[4] = 0;
              local_3d8.data._M_elems[5] = 0;
              local_3d8.data._M_elems[6] = 0;
              local_3d8.data._M_elems[7] = 0;
              local_3d8.data._M_elems[8] = 0;
              local_3d8.data._M_elems[9] = 0;
              local_3d8.data._M_elems[10] = 0;
              local_3d8.data._M_elems[0xb] = 0;
              local_3d8.data._M_elems[0xc] = 0;
              local_3d8.data._M_elems[0xd] = 0;
              local_3d8.data._M_elems[0xe] = 0;
              local_3d8.data._M_elems[0xf] = 0;
              local_3d8.data._M_elems[0x10] = 0;
              local_3d8.data._M_elems[0x11] = 0;
              local_3d8.data._M_elems[0x12] = 0;
              local_3d8.data._M_elems[0x13] = 0;
              local_3d8.data._M_elems[0x14] = 0;
              local_3d8.data._M_elems[0x15] = 0;
              local_3d8.data._M_elems[0x16] = 0;
              local_3d8.data._M_elems[0x17] = 0;
              local_3d8.data._M_elems[0x18] = 0;
              local_3d8.data._M_elems[0x19] = 0;
              local_3d8.data._M_elems._104_5_ = 0;
              local_3d8.data._M_elems[0x1b]._1_3_ = 0;
              local_3d8.exp = 0;
              local_3d8.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_3d8,RVar23);
              local_468.val.m_backend.fpclass = cpp_dec_float_finite;
              local_468.val.m_backend.prec_elem = 0x1c;
              local_468.val.m_backend.data._M_elems[0] = 0;
              local_468.val.m_backend.data._M_elems[1] = 0;
              local_468.val.m_backend.data._M_elems[2] = 0;
              local_468.val.m_backend.data._M_elems[3] = 0;
              local_468.val.m_backend.data._M_elems[4] = 0;
              local_468.val.m_backend.data._M_elems[5] = 0;
              local_468.val.m_backend.data._M_elems[6] = 0;
              local_468.val.m_backend.data._M_elems[7] = 0;
              local_468.val.m_backend.data._M_elems[8] = 0;
              local_468.val.m_backend.data._M_elems[9] = 0;
              local_468.val.m_backend.data._M_elems[10] = 0;
              local_468.val.m_backend.data._M_elems[0xb] = 0;
              local_468.val.m_backend.data._M_elems[0xc] = 0;
              local_468.val.m_backend.data._M_elems[0xd] = 0;
              local_468.val.m_backend.data._M_elems[0xe] = 0;
              local_468.val.m_backend.data._M_elems[0xf] = 0;
              local_468.val.m_backend.data._M_elems[0x10] = 0;
              local_468.val.m_backend.data._M_elems[0x11] = 0;
              local_468.val.m_backend.data._M_elems[0x12] = 0;
              local_468.val.m_backend.data._M_elems[0x13] = 0;
              local_468.val.m_backend.data._M_elems[0x14] = 0;
              local_468.val.m_backend.data._M_elems[0x15] = 0;
              local_468.val.m_backend.data._M_elems[0x16] = 0;
              local_468.val.m_backend.data._M_elems[0x17] = 0;
              local_468.val.m_backend.data._M_elems[0x18] = 0;
              local_468.val.m_backend.data._M_elems[0x19] = 0;
              local_468.val.m_backend.data._M_elems._104_5_ = 0;
              local_468.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              local_468.val.m_backend.exp = 0;
              local_468.val.m_backend.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_518,1,(type *)0x0);
              this = local_490;
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        ((cpp_dec_float<200U,_int,_void> *)&local_468,&local_518,&local_3d8);
              pNVar18 = &local_468;
              pcVar15 = pcVar13;
              for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                (pcVar15->data)._M_elems[0] = (pNVar18->val).m_backend.data._M_elems[0];
                pNVar18 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)((long)pNVar18 + (ulong)bVar22 * -8 + 4);
                pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar22 * -8 + 4)
                ;
              }
              pcVar13->exp = local_468.val.m_backend.exp;
              pcVar13->neg = local_468.val.m_backend.neg;
              pcVar13->fpclass = local_468.val.m_backend.fpclass;
              pcVar13->prec_elem = local_468.val.m_backend.prec_elem;
            }
          }
          else {
            pcVar15 = &local_1a8;
            pcVar21 = pcVar13;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pcVar21->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar22 * -8 + 4);
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar22 * -8 + 4);
            }
            pcVar13->exp = local_1a8.exp;
            pcVar13->neg = local_1a8.neg;
            pcVar13->fpclass = local_1a8.fpclass;
            pcVar13->prec_elem = local_1a8.prec_elem;
            this = local_490;
          }
          local_470 = local_470 + -1;
        } while (1 < local_470);
      }
      lVar10 = (long)(local_3e0->thedelta).super_IdxSet.num;
      if (0 < lVar10) {
        pcVar13 = &(this->pi_p).m_backend;
        local_480 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)*(double *)(in_FS_OFFSET + -8);
        local_488 = pcVar13;
        do {
          local_470 = lVar10;
          lVar10 = (long)(local_3e0->thedelta).super_IdxSet.idx[lVar10 + -1];
          local_478 = (pointer)(lVar10 * 0x80);
          pcVar21 = &local_2b8[lVar10].m_backend;
          local_518.fpclass = cpp_dec_float_finite;
          local_518.prec_elem = 0x1c;
          local_518.data._M_elems[0] = 0;
          local_518.data._M_elems[1] = 0;
          local_518.data._M_elems[2] = 0;
          local_518.data._M_elems[3] = 0;
          local_518.data._M_elems[4] = 0;
          local_518.data._M_elems[5] = 0;
          local_518.data._M_elems[6] = 0;
          local_518.data._M_elems[7] = 0;
          local_518.data._M_elems[8] = 0;
          local_518.data._M_elems[9] = 0;
          local_518.data._M_elems[10] = 0;
          local_518.data._M_elems[0xb] = 0;
          local_518.data._M_elems[0xc] = 0;
          local_518.data._M_elems[0xd] = 0;
          local_518.data._M_elems[0xe] = 0;
          local_518.data._M_elems[0xf] = 0;
          local_518.data._M_elems[0x10] = 0;
          local_518.data._M_elems[0x11] = 0;
          local_518.data._M_elems[0x12] = 0;
          local_518.data._M_elems[0x13] = 0;
          local_518.data._M_elems[0x14] = 0;
          local_518.data._M_elems[0x15] = 0;
          local_518.data._M_elems[0x16] = 0;
          local_518.data._M_elems[0x17] = 0;
          local_518.data._M_elems[0x18] = 0;
          local_518.data._M_elems[0x19] = 0;
          local_518.data._M_elems._104_5_ = 0;
          local_518.data._M_elems[0x1b]._1_3_ = 0;
          local_518.exp = 0;
          local_518.neg = false;
          pcVar15 = &local_128;
          if (&local_518 != pcVar21) {
            pcVar19 = &local_518;
            for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
              *(uint *)pcVar19 = (pcVar15->data)._M_elems[0];
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar22 * -8 + 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar19 + ((ulong)bVar22 * -2 + 1) * 4);
            }
            local_518.exp = local_128.exp;
            local_518.neg = local_128.neg;
            local_518.fpclass = local_128.fpclass;
            local_518.prec_elem = local_128.prec_elem;
            pcVar15 = pcVar21;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_518,pcVar15);
          pcVar15 = &local_518;
          pcVar21 = &local_2a8;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar21->data)._M_elems[0] = *(uint *)pcVar15;
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar15 + ((ulong)bVar22 * -2 + 1) * 4);
            pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar22 * -8 + 4);
          }
          local_2a8.exp = local_518.exp;
          local_2a8.neg = local_518.neg;
          local_2a8.fpclass = local_518.fpclass;
          local_2a8.prec_elem = local_518.prec_elem;
          local_358.fpclass = cpp_dec_float_finite;
          local_358.prec_elem = 0x1c;
          local_358.data._M_elems[0] = 0;
          local_358.data._M_elems[1] = 0;
          local_358.data._M_elems[2] = 0;
          local_358.data._M_elems[3] = 0;
          local_358.data._M_elems[4] = 0;
          local_358.data._M_elems[5] = 0;
          local_358.data._M_elems[6] = 0;
          local_358.data._M_elems[7] = 0;
          local_358.data._M_elems[8] = 0;
          local_358.data._M_elems[9] = 0;
          local_358.data._M_elems[10] = 0;
          local_358.data._M_elems[0xb] = 0;
          local_358.data._M_elems[0xc] = 0;
          local_358.data._M_elems[0xd] = 0;
          local_358.data._M_elems[0xe] = 0;
          local_358.data._M_elems[0xf] = 0;
          local_358.data._M_elems[0x10] = 0;
          local_358.data._M_elems[0x11] = 0;
          local_358.data._M_elems[0x12] = 0;
          local_358.data._M_elems[0x13] = 0;
          local_358.data._M_elems[0x14] = 0;
          local_358.data._M_elems[0x15] = 0;
          local_358.data._M_elems[0x16] = 0;
          local_358.data._M_elems[0x17] = 0;
          local_358.data._M_elems[0x18] = 0;
          local_358.data._M_elems[0x19] = 0;
          local_358.data._M_elems._104_5_ = 0;
          local_358.data._M_elems[0x1b]._1_3_ = 0;
          local_358.exp = 0;
          local_358.neg = false;
          pcVar15 = &local_2a8;
          if (&local_358 != pcVar13) {
            pcVar21 = &local_358;
            for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
              (pcVar21->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar22 * -8 + 4);
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar22 * -8 + 4);
            }
            local_358.exp = local_518.exp;
            local_358.neg = local_518.neg;
            local_358.fpclass = local_518.fpclass;
            local_358.prec_elem = local_518.prec_elem;
            pcVar15 = pcVar13;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_358,pcVar15);
          pSVar4 = ((this->
                    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->thevectors;
          pIVar5 = (pSVar4->set).theitem;
          iVar9 = (pSVar4->set).thekey[lVar10].idx;
          local_518.fpclass = cpp_dec_float_finite;
          local_518.prec_elem = 0x1c;
          local_518.data._M_elems[0] = 0;
          local_518.data._M_elems[1] = 0;
          local_518.data._M_elems[2] = 0;
          local_518.data._M_elems[3] = 0;
          local_518.data._M_elems[4] = 0;
          local_518.data._M_elems[5] = 0;
          local_518.data._M_elems[6] = 0;
          local_518.data._M_elems[7] = 0;
          local_518.data._M_elems[8] = 0;
          local_518.data._M_elems[9] = 0;
          local_518.data._M_elems[10] = 0;
          local_518.data._M_elems[0xb] = 0;
          local_518.data._M_elems[0xc] = 0;
          local_518.data._M_elems[0xd] = 0;
          local_518.data._M_elems[0xe] = 0;
          local_518.data._M_elems[0xf] = 0;
          local_518.data._M_elems[0x10] = 0;
          local_518.data._M_elems[0x11] = 0;
          local_518.data._M_elems[0x12] = 0;
          local_518.data._M_elems[0x13] = 0;
          local_518.data._M_elems[0x14] = 0;
          local_518.data._M_elems[0x15] = 0;
          local_518.data._M_elems[0x16] = 0;
          local_518.data._M_elems[0x17] = 0;
          local_518.data._M_elems[0x18] = 0;
          local_518.data._M_elems[0x19] = 0;
          local_518.data._M_elems._104_5_ = 0;
          local_518.data._M_elems[0x1b]._1_3_ = 0;
          local_518.exp = 0;
          local_518.neg = false;
          iVar12 = pIVar5[iVar9].data.
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused;
          if (0 < iVar12) {
            pNVar18 = pIVar5[iVar9].data.
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
            iVar12 = iVar12 + 1;
            do {
              pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((this->workVec).
                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + pNVar18->idx);
              local_468.val.m_backend.fpclass = cpp_dec_float_finite;
              local_468.val.m_backend.prec_elem = 0x1c;
              local_468.val.m_backend.data._M_elems[0] = 0;
              local_468.val.m_backend.data._M_elems[1] = 0;
              local_468.val.m_backend.data._M_elems[2] = 0;
              local_468.val.m_backend.data._M_elems[3] = 0;
              local_468.val.m_backend.data._M_elems[4] = 0;
              local_468.val.m_backend.data._M_elems[5] = 0;
              local_468.val.m_backend.data._M_elems[6] = 0;
              local_468.val.m_backend.data._M_elems[7] = 0;
              local_468.val.m_backend.data._M_elems[8] = 0;
              local_468.val.m_backend.data._M_elems[9] = 0;
              local_468.val.m_backend.data._M_elems[10] = 0;
              local_468.val.m_backend.data._M_elems[0xb] = 0;
              local_468.val.m_backend.data._M_elems[0xc] = 0;
              local_468.val.m_backend.data._M_elems[0xd] = 0;
              local_468.val.m_backend.data._M_elems[0xe] = 0;
              local_468.val.m_backend.data._M_elems[0xf] = 0;
              local_468.val.m_backend.data._M_elems[0x10] = 0;
              local_468.val.m_backend.data._M_elems[0x11] = 0;
              local_468.val.m_backend.data._M_elems[0x12] = 0;
              local_468.val.m_backend.data._M_elems[0x13] = 0;
              local_468.val.m_backend.data._M_elems[0x14] = 0;
              local_468.val.m_backend.data._M_elems[0x15] = 0;
              local_468.val.m_backend.data._M_elems[0x16] = 0;
              local_468.val.m_backend.data._M_elems[0x17] = 0;
              local_468.val.m_backend.data._M_elems[0x18] = 0;
              local_468.val.m_backend.data._M_elems[0x19] = 0;
              local_468.val.m_backend.data._M_elems._104_5_ = 0;
              local_468.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              local_468.val.m_backend.exp = 0;
              local_468.val.m_backend.neg = false;
              v = pNVar18;
              if ((&local_468 != pNVar16) && (v = pNVar16, pNVar18 != &local_468)) {
                pNVar16 = pNVar18;
                pNVar20 = &local_468;
                for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                  (pNVar20->val).m_backend.data._M_elems[0] =
                       (pNVar16->val).m_backend.data._M_elems[0];
                  pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)((long)pNVar16 + (ulong)bVar22 * -8 + 4);
                  pNVar20 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)((long)pNVar20 + (ulong)bVar22 * -8 + 4);
                }
                local_468.val.m_backend.exp = (pNVar18->val).m_backend.exp;
                local_468.val.m_backend.neg = (pNVar18->val).m_backend.neg;
                local_468.val.m_backend.fpclass = (pNVar18->val).m_backend.fpclass;
                local_468.val.m_backend.prec_elem = (pNVar18->val).m_backend.prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)&local_468,
                         (cpp_dec_float<200U,_int,_void> *)v);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        (&local_518,(cpp_dec_float<200U,_int,_void> *)&local_468);
              pNVar18 = pNVar18 + 1;
              iVar12 = iVar12 + -1;
            } while (1 < iVar12);
          }
          uVar7 = local_518._120_8_;
          bVar6 = local_518.neg;
          iVar9 = local_518.exp;
          pcVar13 = &local_518;
          puVar17 = local_a0;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            *puVar17 = *(uint *)pcVar13;
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar13 + ((ulong)bVar22 * -2 + 1) * 4);
            puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
          }
          local_468.val.m_backend.fpclass = cpp_dec_float_finite;
          local_468.val.m_backend.prec_elem = 0x1c;
          local_468.val.m_backend.data._M_elems[0] = 0;
          local_468.val.m_backend.data._M_elems[1] = 0;
          local_468.val.m_backend.data._M_elems[2] = 0;
          local_468.val.m_backend.data._M_elems[3] = 0;
          local_468.val.m_backend.data._M_elems[4] = 0;
          local_468.val.m_backend.data._M_elems[5] = 0;
          local_468.val.m_backend.data._M_elems[6] = 0;
          local_468.val.m_backend.data._M_elems[7] = 0;
          local_468.val.m_backend.data._M_elems[8] = 0;
          local_468.val.m_backend.data._M_elems[9] = 0;
          local_468.val.m_backend.data._M_elems[10] = 0;
          local_468.val.m_backend.data._M_elems[0xb] = 0;
          local_468.val.m_backend.data._M_elems[0xc] = 0;
          local_468.val.m_backend.data._M_elems[0xd] = 0;
          local_468.val.m_backend.data._M_elems[0xe] = 0;
          local_468.val.m_backend.data._M_elems[0xf] = 0;
          local_468.val.m_backend.data._M_elems[0x10] = 0;
          local_468.val.m_backend.data._M_elems[0x11] = 0;
          local_468.val.m_backend.data._M_elems[0x12] = 0;
          local_468.val.m_backend.data._M_elems[0x13] = 0;
          local_468.val.m_backend.data._M_elems[0x14] = 0;
          local_468.val.m_backend.data._M_elems[0x15] = 0;
          local_468.val.m_backend.data._M_elems[0x16] = 0;
          local_468.val.m_backend.data._M_elems[0x17] = 0;
          local_468.val.m_backend.data._M_elems[0x18] = 0;
          local_468.val.m_backend.data._M_elems[0x19] = 0;
          local_468.val.m_backend.data._M_elems._104_5_ = 0;
          local_468.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          local_468.val.m_backend.exp = 0;
          local_468.val.m_backend.neg = false;
          local_518.fpclass = cpp_dec_float_finite;
          local_518.prec_elem = 0x1c;
          local_518.data._M_elems[0] = 0;
          local_518.data._M_elems[1] = 0;
          local_518.data._M_elems[2] = 0;
          local_518.data._M_elems[3] = 0;
          local_518.data._M_elems[4] = 0;
          local_518.data._M_elems[5] = 0;
          local_518.data._M_elems[6] = 0;
          local_518.data._M_elems[7] = 0;
          local_518.data._M_elems[8] = 0;
          local_518.data._M_elems[9] = 0;
          local_518.data._M_elems[10] = 0;
          local_518.data._M_elems[0xb] = 0;
          local_518.data._M_elems[0xc] = 0;
          local_518.data._M_elems[0xd] = 0;
          local_518.data._M_elems[0xe] = 0;
          local_518.data._M_elems[0xf] = 0;
          local_518.data._M_elems[0x10] = 0;
          local_518.data._M_elems[0x11] = 0;
          local_518.data._M_elems[0x12] = 0;
          local_518.data._M_elems[0x13] = 0;
          local_518.data._M_elems[0x14] = 0;
          local_518.data._M_elems[0x15] = 0;
          local_518.data._M_elems[0x16] = 0;
          local_518.data._M_elems[0x17] = 0;
          local_518.data._M_elems[0x18] = 0;
          local_518.data._M_elems[0x19] = 0;
          local_518.data._M_elems._104_5_ = 0;
          local_518.data._M_elems[0x1b]._1_3_ = 0;
          local_518.exp = 0;
          local_518.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_518,2.0);
          uVar8 = local_518._120_8_;
          puVar17 = local_a0;
          pNVar18 = &local_468;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pNVar18->val).m_backend.data._M_elems[0] = *puVar17;
            puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
            pNVar18 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)pNVar18 + (ulong)bVar22 * -8 + 4);
          }
          local_468.val.m_backend.exp = iVar9;
          local_468.val.m_backend.neg = bVar6;
          local_518.fpclass = (fpclass_type)uVar7;
          local_518.prec_elem = SUB84(uVar7,4);
          local_468.val.m_backend.fpclass = local_518.fpclass;
          local_468.val.m_backend.prec_elem = local_518.prec_elem;
          local_518._120_8_ = uVar8;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)&local_468,&local_518);
          local_228.fpclass = cpp_dec_float_finite;
          local_228.prec_elem = 0x1c;
          local_228.neg = false;
          local_228.exp = 0;
          pcVar13 = &local_358;
          pcVar15 = &local_228;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar22 * -8 + 4);
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar22 * -8 + 4);
          }
          local_228.exp = local_358.exp;
          local_228.neg = local_358.neg;
          local_228.fpclass = local_358.fpclass;
          local_228.prec_elem = local_358.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_228,(cpp_dec_float<200U,_int,_void> *)&local_468);
          local_3d8.fpclass = cpp_dec_float_finite;
          local_3d8.prec_elem = 0x1c;
          local_3d8.exp = 0;
          local_3d8.neg = false;
          pcVar13 = &local_2a8;
          pcVar15 = &local_3d8;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar22 * -8 + 4);
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar22 * -8 + 4);
          }
          local_3d8.exp = local_2a8.exp;
          local_3d8.neg = local_2a8.neg;
          local_3d8.fpclass = local_2a8.fpclass;
          local_3d8.prec_elem = local_2a8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_3d8,&local_228);
          pnVar14 = local_2b0;
          pnVar3 = local_478;
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)&(local_2b0->m_backend).data + (long)local_478);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (pcVar15,&local_3d8);
          if (((*(int *)((long)&(pnVar14->m_backend).data + (long)pnVar3 + 0x78) == 2) ||
              (local_1a8.fpclass == cpp_dec_float_NaN)) ||
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (pcVar15,&local_1a8), -1 < iVar9)) {
            pcVar13 = local_488;
            ::soplex::infinity::__tls_init();
            local_518.fpclass = cpp_dec_float_finite;
            local_518.prec_elem = 0x1c;
            local_518.data._M_elems[0] = 0;
            local_518.data._M_elems[1] = 0;
            local_518.data._M_elems[2] = 0;
            local_518.data._M_elems[3] = 0;
            local_518.data._M_elems[4] = 0;
            local_518.data._M_elems[5] = 0;
            local_518.data._M_elems[6] = 0;
            local_518.data._M_elems[7] = 0;
            local_518.data._M_elems[8] = 0;
            local_518.data._M_elems[9] = 0;
            local_518.data._M_elems[10] = 0;
            local_518.data._M_elems[0xb] = 0;
            local_518.data._M_elems[0xc] = 0;
            local_518.data._M_elems[0xd] = 0;
            local_518.data._M_elems[0xe] = 0;
            local_518.data._M_elems[0xf] = 0;
            local_518.data._M_elems[0x10] = 0;
            local_518.data._M_elems[0x11] = 0;
            local_518.data._M_elems[0x12] = 0;
            local_518.data._M_elems[0x13] = 0;
            local_518.data._M_elems[0x14] = 0;
            local_518.data._M_elems[0x15] = 0;
            local_518.data._M_elems[0x16] = 0;
            local_518.data._M_elems[0x17] = 0;
            local_518.data._M_elems[0x18] = 0;
            local_518.data._M_elems[0x19] = 0;
            local_518.data._M_elems._104_5_ = 0;
            local_518.data._M_elems[0x1b]._1_3_ = 0;
            local_518.exp = 0;
            local_518.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_518,(double)local_480);
            this = local_490;
            if (((pcVar15->fpclass != cpp_dec_float_NaN) && (local_518.fpclass != cpp_dec_float_NaN)
                ) && (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              compare(pcVar15,&local_518), 0 < iVar9)) {
              RVar23 = Tolerances::epsilon((((this->
                                             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).thesolver)->
                                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              local_3d8.fpclass = cpp_dec_float_finite;
              local_3d8.prec_elem = 0x1c;
              local_3d8.data._M_elems[0] = 0;
              local_3d8.data._M_elems[1] = 0;
              local_3d8.data._M_elems[2] = 0;
              local_3d8.data._M_elems[3] = 0;
              local_3d8.data._M_elems[4] = 0;
              local_3d8.data._M_elems[5] = 0;
              local_3d8.data._M_elems[6] = 0;
              local_3d8.data._M_elems[7] = 0;
              local_3d8.data._M_elems[8] = 0;
              local_3d8.data._M_elems[9] = 0;
              local_3d8.data._M_elems[10] = 0;
              local_3d8.data._M_elems[0xb] = 0;
              local_3d8.data._M_elems[0xc] = 0;
              local_3d8.data._M_elems[0xd] = 0;
              local_3d8.data._M_elems[0xe] = 0;
              local_3d8.data._M_elems[0xf] = 0;
              local_3d8.data._M_elems[0x10] = 0;
              local_3d8.data._M_elems[0x11] = 0;
              local_3d8.data._M_elems[0x12] = 0;
              local_3d8.data._M_elems[0x13] = 0;
              local_3d8.data._M_elems[0x14] = 0;
              local_3d8.data._M_elems[0x15] = 0;
              local_3d8.data._M_elems[0x16] = 0;
              local_3d8.data._M_elems[0x17] = 0;
              local_3d8.data._M_elems[0x18] = 0;
              local_3d8.data._M_elems[0x19] = 0;
              local_3d8.data._M_elems._104_5_ = 0;
              local_3d8.data._M_elems[0x1b]._1_3_ = 0;
              local_3d8.exp = 0;
              local_3d8.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_3d8,RVar23);
              local_468.val.m_backend.fpclass = cpp_dec_float_finite;
              local_468.val.m_backend.prec_elem = 0x1c;
              local_468.val.m_backend.data._M_elems[0] = 0;
              local_468.val.m_backend.data._M_elems[1] = 0;
              local_468.val.m_backend.data._M_elems[2] = 0;
              local_468.val.m_backend.data._M_elems[3] = 0;
              local_468.val.m_backend.data._M_elems[4] = 0;
              local_468.val.m_backend.data._M_elems[5] = 0;
              local_468.val.m_backend.data._M_elems[6] = 0;
              local_468.val.m_backend.data._M_elems[7] = 0;
              local_468.val.m_backend.data._M_elems[8] = 0;
              local_468.val.m_backend.data._M_elems[9] = 0;
              local_468.val.m_backend.data._M_elems[10] = 0;
              local_468.val.m_backend.data._M_elems[0xb] = 0;
              local_468.val.m_backend.data._M_elems[0xc] = 0;
              local_468.val.m_backend.data._M_elems[0xd] = 0;
              local_468.val.m_backend.data._M_elems[0xe] = 0;
              local_468.val.m_backend.data._M_elems[0xf] = 0;
              local_468.val.m_backend.data._M_elems[0x10] = 0;
              local_468.val.m_backend.data._M_elems[0x11] = 0;
              local_468.val.m_backend.data._M_elems[0x12] = 0;
              local_468.val.m_backend.data._M_elems[0x13] = 0;
              local_468.val.m_backend.data._M_elems[0x14] = 0;
              local_468.val.m_backend.data._M_elems[0x15] = 0;
              local_468.val.m_backend.data._M_elems[0x16] = 0;
              local_468.val.m_backend.data._M_elems[0x17] = 0;
              local_468.val.m_backend.data._M_elems[0x18] = 0;
              local_468.val.m_backend.data._M_elems[0x19] = 0;
              local_468.val.m_backend.data._M_elems._104_5_ = 0;
              local_468.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              local_468.val.m_backend.exp = 0;
              local_468.val.m_backend.neg = false;
              local_518.fpclass = cpp_dec_float_finite;
              local_518.prec_elem = 0x1c;
              local_518.data._M_elems[0] = 0;
              local_518.data._M_elems[1] = 0;
              local_518.data._M_elems[2] = 0;
              local_518.data._M_elems[3] = 0;
              local_518.data._M_elems[4] = 0;
              local_518.data._M_elems[5] = 0;
              local_518.data._M_elems[6] = 0;
              local_518.data._M_elems[7] = 0;
              local_518.data._M_elems[8] = 0;
              local_518.data._M_elems[9] = 0;
              local_518.data._M_elems[10] = 0;
              local_518.data._M_elems[0xb] = 0;
              local_518.data._M_elems[0xc] = 0;
              local_518.data._M_elems[0xd] = 0;
              local_518.data._M_elems[0xe] = 0;
              local_518.data._M_elems[0xf] = 0;
              local_518.data._M_elems[0x10] = 0;
              local_518.data._M_elems[0x11] = 0;
              local_518.data._M_elems[0x12] = 0;
              local_518.data._M_elems[0x13] = 0;
              local_518.data._M_elems[0x14] = 0;
              local_518.data._M_elems[0x15] = 0;
              local_518.data._M_elems[0x16] = 0;
              local_518.data._M_elems[0x17] = 0;
              local_518.data._M_elems[0x18] = 0;
              local_518.data._M_elems[0x19] = 0;
              local_518.data._M_elems._104_5_ = 0;
              local_518.data._M_elems[0x1b]._1_3_ = 0;
              local_518.exp = 0;
              local_518.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_518,1.0);
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        ((cpp_dec_float<200U,_int,_void> *)&local_468,&local_518,&local_3d8);
              pNVar18 = &local_468;
              pcVar21 = pcVar15;
              for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                (pcVar21->data)._M_elems[0] = (pNVar18->val).m_backend.data._M_elems[0];
                pNVar18 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)((long)pNVar18 + (ulong)bVar22 * -8 + 4);
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar22 * -8 + 4)
                ;
              }
              pcVar15->exp = local_468.val.m_backend.exp;
              pcVar15->neg = local_468.val.m_backend.neg;
              pcVar15->fpclass = local_468.val.m_backend.fpclass;
              pcVar15->prec_elem = local_468.val.m_backend.prec_elem;
            }
          }
          else {
            pcVar13 = &local_1a8;
            pcVar21 = pcVar15;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pcVar21->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar22 * -8 + 4);
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar22 * -8 + 4);
            }
            pcVar15->exp = local_1a8.exp;
            pcVar15->neg = local_1a8.neg;
            pcVar15->fpclass = local_1a8.fpclass;
            pcVar15->prec_elem = local_1a8.prec_elem;
            this = local_490;
            pcVar13 = local_488;
          }
          lVar10 = local_470 + -1;
        } while (1 < local_470);
      }
    }
  }
  return;
}

Assistant:

void SPxSteepPR<R>::entered4(SPxId /* id */, int n)
{
   assert(this->thesolver->type() == SPxSolverBase<R>::ENTER);

   if(n >= 0 && n < this->thesolver->dim())
   {
      R delta = 2 + 1.0 / this->thesolver->basis().iteration();
      R* coWeights_ptr = this->thesolver->coWeights.get_ptr();
      R* weights_ptr = this->thesolver->weights.get_ptr();
      const R* workVec_ptr = workVec.get_const_ptr();
      const R* pVec = this->thesolver->pVec().delta().values();
      const IdxSet& pIdx = this->thesolver->pVec().idx();
      const R* coPvec = this->thesolver->coPvec().delta().values();
      const IdxSet& coPidx = this->thesolver->coPvec().idx();
      R xi_p = 1 / this->thesolver->fVec().delta()[n];
      int i, j;
      R xi_ip;

      assert(this->thesolver->fVec().delta()[n] > this->thesolver->epsilon()
             || this->thesolver->fVec().delta()[n] < -this->thesolver->epsilon());

      for(j = coPidx.size() - 1; j >= 0; --j)
      {
         i = coPidx.index(j);
         xi_ip = xi_p * coPvec[i];
         coWeights_ptr[i] += xi_ip * (xi_ip * pi_p - 2.0 * workVec_ptr[i]);

         /*
           if(coWeights_ptr[i] < 1)
           coWeights_ptr[i] = 1 / (2-x);
         */
         if(coWeights_ptr[i] < delta)
            coWeights_ptr[i] = delta;
         // coWeights_ptr[i] = 1;
         else if(coWeights_ptr[i] > R(infinity))
            coWeights_ptr[i] = 1 / this->thesolver->epsilon();
      }

      for(j = pIdx.size() - 1; j >= 0; --j)
      {
         i = pIdx.index(j);
         xi_ip = xi_p * pVec[i];
         weights_ptr[i] += xi_ip * (xi_ip * pi_p - 2.0 * (this->thesolver->vector(i) * workVec));

         /*
           if(weights_ptr[i] < 1)
           weights_ptr[i] = 1 / (2-x);
         */
         if(weights_ptr[i] < delta)
            weights_ptr[i] = delta;
         // weights_ptr[i] = 1;
         else if(weights_ptr[i] > R(infinity))
            weights_ptr[i] = 1.0 / this->thesolver->epsilon();
      }
   }

   /*@
     if(this->thesolver->isId(id))
     weights[   this->thesolver->number(id) ] *= 1.0001;
     else if(this->thesolver->isCoId(id))
     coWeights[ this->thesolver->number(id) ] *= 1.0001;
   */

}